

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O0

IterateResult __thiscall
dit::anon_unknown_1::SeedBuilderMultipleValuesTest::iterate(SeedBuilderMultipleValuesTest *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  TestLog *this_00;
  SeedBuilder *builder;
  MessageBuilder *pMVar3;
  deUint32 local_4cc;
  MessageBuilder local_4c8;
  deUint32 local_344;
  MessageBuilder local_340;
  deUint32 local_1c0 [4];
  MessageBuilder local_1b0;
  SeedBuilder local_2c;
  SeedBuilder local_28;
  SeedBuilder builderAB;
  SeedBuilder builderB;
  SeedBuilder builderA;
  deUint32 b;
  deUint32 a;
  TestLog *log;
  SeedBuilderMultipleValuesTest *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  builderA.m_hash = 0x4a238ab;
  builderB.m_hash = 0xe455bd08;
  tcu::SeedBuilder::SeedBuilder(&builderAB);
  tcu::SeedBuilder::SeedBuilder(&local_28);
  tcu::SeedBuilder::SeedBuilder(&local_2c);
  tcu::operator<<(&builderAB,0x4a238ab);
  tcu::operator<<(&local_28,0xe455bd08);
  builder = tcu::operator<<(&local_2c,0x4a238ab);
  tcu::operator<<(builder,0xe455bd08);
  tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [10])"Value a: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&builderA.m_hash);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])", Seed a: ");
  local_1c0[0] = tcu::SeedBuilder::get(&builderAB);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c0);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  tcu::TestLog::operator<<(&local_340,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [10])"Value b: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&builderB.m_hash);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])", Seed b: ");
  local_344 = tcu::SeedBuilder::get(&local_28);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_344);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_340);
  tcu::TestLog::operator<<(&local_4c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_4c8,(char (*) [10])"Seed ab: ");
  local_4cc = tcu::SeedBuilder::get(&local_2c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_4cc);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4c8);
  dVar1 = tcu::SeedBuilder::get(&builderAB);
  dVar2 = tcu::SeedBuilder::get(&local_2c);
  if (dVar1 == dVar2) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Seed seems to only depends on first value.");
  }
  else {
    dVar1 = tcu::SeedBuilder::get(&local_28);
    dVar2 = tcu::SeedBuilder::get(&local_2c);
    if (dVar1 == dVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Seed seems to only depends on second value.");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		const deUint32		a			= 77740203u;
		const deUint32		b			= 3830824200u;

		tcu::SeedBuilder	builderA;
		tcu::SeedBuilder	builderB;
		tcu::SeedBuilder	builderAB;

		builderA << a;
		builderB << b;

		builderAB << a << b;

		log << TestLog::Message << "Value a: " << a << ", Seed a: " << builderA.get() << TestLog::EndMessage;
		log << TestLog::Message << "Value b: " << b << ", Seed b: " << builderB.get() << TestLog::EndMessage;
		log << TestLog::Message << "Seed ab: " << builderAB.get() << TestLog::EndMessage;

		if (builderA.get() == builderAB.get())
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Seed seems to only depends on first value.");
		else if (builderB.get() == builderAB.get())
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Seed seems to only depends on second value.");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}